

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

void Fra_LcrRemapPartitions(Vec_Ptr_t *vParts,Fra_Cla_t *pCla,int *pInToOutPart,int *pInToOutNum)

{
  int iVar1;
  void *__ptr;
  long *plVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  uVar9 = (ulong)(uint)vParts->nSize;
  if (0 < vParts->nSize) {
    iVar6 = pCla->pAig->nObjs[3] - pCla->pAig->nObjs[2];
    lVar10 = 0;
    do {
      iVar7 = (int)uVar9;
      __ptr = vParts->pArray[lVar10];
      iVar1 = *(int *)((long)__ptr + 4);
      p = (Vec_Int_t *)malloc(0x10);
      if (iVar1 - 1U < 0xf) {
        iVar1 = 0x10;
      }
      p->nSize = 0;
      p->nCap = iVar1;
      if (iVar1 == 0) {
        piVar4 = (int *)0x0;
      }
      else {
        piVar4 = (int *)malloc((long)iVar1 << 2);
      }
      p->pArray = piVar4;
      if (0 < *(int *)((long)__ptr + 4)) {
        lVar8 = 0;
        do {
          uVar3 = *(uint *)(*(long *)((long)__ptr + 8) + lVar8 * 4);
          iVar1 = pCla->vClasses->nSize;
          if ((int)uVar3 < iVar1) {
            if ((int)uVar3 < 0) {
LAB_0060600c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar5 = (undefined8 *)pCla->vClasses->pArray[uVar3];
            plVar2 = (long *)*puVar5;
            while (plVar2 != (long *)0x0) {
              puVar5 = puVar5 + 1;
              pInToOutPart[*plVar2] = (int)lVar10;
              pInToOutNum[*plVar2] = p->nSize;
              Vec_IntPush(p,(int)*plVar2 + iVar6);
              plVar2 = (long *)*puVar5;
            }
          }
          else {
            uVar3 = uVar3 - iVar1;
            if (((int)uVar3 < 0) || (pCla->vClasses1->nSize <= (int)uVar3)) goto LAB_0060600c;
            plVar2 = (long *)pCla->vClasses1->pArray[uVar3];
            pInToOutPart[*plVar2] = (int)lVar10;
            pInToOutNum[*plVar2] = p->nSize;
            Vec_IntPush(p,(int)*plVar2 + iVar6);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)((long)__ptr + 4));
        iVar7 = vParts->nSize;
      }
      if (iVar7 <= lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vParts->pArray[lVar10] = p;
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
      }
      free(__ptr);
      lVar10 = lVar10 + 1;
      uVar9 = (ulong)vParts->nSize;
    } while (lVar10 < (long)uVar9);
  }
  return;
}

Assistant:

void Fra_LcrRemapPartitions( Vec_Ptr_t * vParts, Fra_Cla_t * pCla, int * pInToOutPart, int * pInToOutNum )
{
    Vec_Int_t * vOne, * vOneNew;
    Aig_Obj_t ** ppClass, * pObjPi;
    int Out, Offset, i, k, c;
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(pCla->pAig) - Aig_ManCiNum(pCla->pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        vOneNew = Vec_IntAlloc( Vec_IntSize(vOne) );
        Vec_IntForEachEntry( vOne, Out, k )
        {
            if ( Out < Vec_PtrSize(pCla->vClasses) )
            {
                ppClass = (Aig_Obj_t **)Vec_PtrEntry( pCla->vClasses, Out );
                for ( c = 0; ppClass[c]; c++ )
                {
                    pInToOutPart[(long)ppClass[c]->pNext] = i;
                    pInToOutNum[(long)ppClass[c]->pNext] = Vec_IntSize(vOneNew);
                    Vec_IntPush( vOneNew, Offset+(long)ppClass[c]->pNext );
                }
            }
            else
            {
                pObjPi = (Aig_Obj_t *)Vec_PtrEntry( pCla->vClasses1, Out - Vec_PtrSize(pCla->vClasses) );
                pInToOutPart[(long)pObjPi->pNext] = i;
                pInToOutNum[(long)pObjPi->pNext] = Vec_IntSize(vOneNew);
                Vec_IntPush( vOneNew, Offset+(long)pObjPi->pNext );
            }
        }
        // replace the class
        Vec_PtrWriteEntry( vParts, i, vOneNew );
        Vec_IntFree( vOne );
    }
}